

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

mallinfo2 * tc_mallinfo2(void)

{
  size_t sVar1;
  mallinfo2 *in_RDI;
  TCMallocStats local_90;
  
  local_90.pageheap.total_decommit_bytes = 0;
  local_90.pageheap.reserve_count = 0;
  local_90.pageheap.total_commit_bytes = 0;
  local_90.pageheap.decommit_count = 0;
  local_90.pageheap.scavenge_count = 0;
  local_90.pageheap.commit_count = 0;
  local_90.pageheap.unmapped_bytes = 0;
  local_90.pageheap.committed_bytes = 0;
  local_90.pageheap.system_bytes = 0;
  local_90.pageheap.free_bytes = 0;
  local_90.pageheap.total_reserve_bytes = 0;
  ExtractStats(&local_90,(uint64_t *)0x0,(SmallSpanStats *)0x0,(LargeSpanStats *)0x0);
  in_RDI->uordblks = 0;
  in_RDI->fordblks = 0;
  in_RDI->usmblks = 0;
  in_RDI->fsmblks = 0;
  in_RDI->hblks = 0;
  in_RDI->hblkhd = 0;
  in_RDI->ordblks = 0;
  in_RDI->smblks = 0;
  in_RDI->keepcost = 0;
  in_RDI->arena = local_90.pageheap.system_bytes;
  sVar1 = local_90.central_bytes + local_90.thread_bytes + local_90.transfer_bytes;
  in_RDI->fsmblks = sVar1;
  in_RDI->fordblks = local_90.pageheap.free_bytes + local_90.pageheap.unmapped_bytes;
  in_RDI->uordblks =
       local_90.pageheap.system_bytes -
       (local_90.pageheap.free_bytes + local_90.pageheap.unmapped_bytes + sVar1);
  return in_RDI;
}

Assistant:

PERFTOOLS_DLL_DECL struct mallinfo2 tc_mallinfo2(void) PERFTOOLS_NOTHROW {
  return do_mallinfo<struct mallinfo2>();
}